

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O2

void cfg_help_choice(autobuf *out,_Bool preamble,_func_char_ptr_size_t_void_ptr *callback,
                    size_t choice_count,void *ptr)

{
  char *pcVar1;
  size_t sVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  if ((int)CONCAT71(in_register_00000031,preamble) != 0) {
    cfg_append_printable_line(out,"    Parameter must be on of the following list:");
  }
  abuf_puts(out,"    ");
  for (sVar2 = 0; choice_count != sVar2; sVar2 = sVar2 + 1) {
    pcVar3 = ", ";
    if (sVar2 == 0) {
      pcVar3 = "";
    }
    pcVar1 = (*callback)(sVar2,ptr);
    abuf_appendf(out,"%s\'%s\'",pcVar3,pcVar1);
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
cfg_help_choice(struct autobuf *out, bool preamble, const char *(*callback)(size_t idx, const void *ptr),
  size_t choice_count, const void *ptr) {
  size_t i;

  if (preamble) {
    cfg_append_printable_line(out, CFG_HELP_INDENT_PREFIX "Parameter must be on of the following list:");
  }

  abuf_puts(out, "    ");
  for (i = 0; i < choice_count; i++) {
    abuf_appendf(out, "%s'%s'", i == 0 ? "" : ", ", callback(i, ptr));
  }
  abuf_puts(out, "\n");
}